

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

double wdm::utils::perm_sum(vector<double,_std::allocator<double>_> *x,size_t k)

{
  long lVar1;
  ulong uVar2;
  size_t k_00;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double local_48;
  utils local_40 [24];
  
  if (k != 0) {
    k_00 = k - 1;
    local_48 = 0.0;
    for (uVar2 = 1; uVar2 <= k; uVar2 = uVar2 + 1) {
      lVar1 = uVar2 - 1;
      auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar5._0_8_ = lVar1;
      auVar5._12_4_ = 0x45300000;
      dVar7 = (auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
      dVar3 = ::pow(-1.0,dVar7);
      dVar4 = perm_sum(x,k_00);
      pow(local_40,dVar4 * dVar3,dVar7);
      dVar7 = sum((vector<double,_std::allocator<double>_> *)local_40);
      local_48 = local_48 + dVar7 * dVar4 * dVar3;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)local_40);
      k_00 = k_00 - 1;
    }
    auVar6._8_4_ = (int)(k >> 0x20);
    auVar6._0_8_ = k;
    auVar6._12_4_ = 0x45300000;
    return local_48 /
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
  }
  return 1.0;
}

Assistant:

inline double perm_sum(const std::vector<double>& x, size_t k)
{
    if (k == 0)
        return 1.0;
    double s = 0;
    for (size_t i = 1; i <= k; i++)
        s += std::pow(-1.0, i - 1) * perm_sum(x, k - i) * sum(pow(x, i));
    return s / k;
}